

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQInteger __thiscall SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  ulong uVar3;
  SQLocalVarInfo *pSVar4;
  SQUnsignedInteger SVar5;
  SQLocalVarInfo lvi;
  SQObjectPtr local_40;
  SQUnsignedInteger SStack_30;
  SQUnsignedInteger local_28;
  ulong uStack_20;
  
  SVar2 = (this->_vlocals)._size;
  local_28 = 0;
  local_40.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  local_40.super_SQObject._type = name->_type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SStack_30 = (this->_instructions)._size;
  uStack_20 = (this->_vlocals)._size;
  uVar3 = (this->_vlocals)._allocated;
  if (uVar3 <= uStack_20) {
    SVar5 = 4;
    if (uStack_20 * 2 != 0) {
      SVar5 = uStack_20 * 2;
    }
    pSVar4 = (SQLocalVarInfo *)sq_vm_realloc((this->_vlocals)._vals,uVar3 * 0x28,SVar5 * 0x28);
    (this->_vlocals)._vals = pSVar4;
    (this->_vlocals)._allocated = SVar5;
  }
  SVar5 = (this->_vlocals)._size;
  (this->_vlocals)._size = SVar5 + 1;
  pSVar4 = (this->_vlocals)._vals + SVar5;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (pSVar4->_name).super_SQObject._type = OT_NULL;
  (pSVar4->_name).super_SQObject._unVal.pTable = (SQTable *)local_40.super_SQObject._unVal;
  (pSVar4->_name).super_SQObject._type = local_40.super_SQObject._type;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &(((pSVar4->_name).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  pSVar4->_start_op = SStack_30;
  pSVar4->_end_op = local_28;
  pSVar4->_pos = uStack_20;
  uVar3 = (this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar3) {
    this->_stacksize = uVar3;
  }
  SQObjectPtr::~SQObjectPtr(&local_40);
  return SVar2;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}